

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O1

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_device_cache_property_flag_t val)

{
  long lVar1;
  ulong uVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  string str;
  undefined1 *local_80;
  ulong local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  local_78 = 0;
  local_70 = 0;
  local_80 = &local_70;
  if (val == 0) {
    std::__cxx11::string::append((char *)&local_80);
  }
  if ((val & ZE_DEVICE_CACHE_PROPERTY_FLAG_USER_CONTROL) != 0) {
    std::__cxx11::string::append((char *)&local_80);
  }
  uVar2 = local_78;
  if (local_78 < 4) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"Device::{ ? }","");
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,(ulong)&local_80);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x10b44f);
    local_60 = &local_50;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_50 = *plVar4;
      lStack_48 = plVar3[3];
    }
    else {
      local_50 = *plVar4;
      local_60 = (long *)*plVar3;
    }
    local_58 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      lVar1 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
  }
  if (3 < uVar2) {
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_device_cache_property_flag_t val )
{
    const auto bits = static_cast<uint32_t>( val );

    std::string str;

    if( 0 == bits )
        str += "0 | ";
    
    if( static_cast<uint32_t>(ZE_DEVICE_CACHE_PROPERTY_FLAG_USER_CONTROL) & bits )
        str += "CACHE_PROPERTY_FLAG_USER_CONTROL | ";

    return ( str.size() > 3 ) 
        ? "Device::{ " + str.substr(0, str.size() - 3) + " }"
        : "Device::{ ? }";
}